

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O2

bool __thiscall rapic::client::process_traffic(client *this)

{
  uint uVar1;
  uint __i;
  int iVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  time_t tVar6;
  ssize_t sVar7;
  size_t sVar8;
  runtime_error *this_00;
  system_error *psVar9;
  error_category *peVar10;
  ulong uVar11;
  ulong uVar12;
  code *pcVar13;
  undefined *puVar14;
  ulong uVar15;
  error_code __ec;
  error_code __ec_00;
  error_code __ec_01;
  error_code __ec_02;
  error_code __ec_03;
  socklen_t len;
  undefined4 uStack_b4;
  __suseconds_t local_b0;
  int res;
  
  if (this->state_ == disconnected) {
    return false;
  }
  if (this->state_ != in_progress) {
LAB_001087dd:
    tVar6 = time((time_t *)0x0);
    if (this->keepalive_period_ < tVar6 - this->last_keepalive_) {
      std::__cxx11::string::append((string *)&this->wbuffer_);
      this->last_keepalive_ = tVar6;
    }
    if ((this->wbuffer_)._M_string_length != 0) {
      do {
        sVar7 = write(this->socket_,(this->wbuffer_)._M_dataplus._M_p,
                      (this->wbuffer_)._M_string_length);
        if (sVar7 != -1) goto LAB_0010884f;
        puVar5 = (uint *)__errno_location();
      } while (*puVar5 == 4);
      if (*puVar5 != 0xb) {
        psVar9 = (system_error *)__cxa_allocate_exception(0x20);
        uVar1 = *puVar5;
        peVar10 = (error_category *)std::_V2::system_category();
        __ec_00._4_4_ = 0;
        __ec_00._M_value = uVar1;
        __ec_00._M_cat = peVar10;
        std::system_error::system_error(psVar9,__ec_00,"rapic: write failure");
        __cxa_throw(psVar9,&std::system_error::typeinfo,std::system_error::~system_error);
      }
LAB_0010884f:
      std::__cxx11::string::erase((ulong)&this->wbuffer_,0);
    }
    do {
      if ((this->wcount_).super___atomic_base<unsigned_long>._M_i -
          (this->rcount_).super___atomic_base<unsigned_long>._M_i == this->capacity_) {
        return true;
      }
      uVar11 = (this->rcount_).super___atomic_base<unsigned_long>._M_i % this->capacity_;
      uVar12 = (this->wcount_).super___atomic_base<unsigned_long>._M_i % this->capacity_;
      uVar15 = this->capacity_;
      if (uVar12 < uVar11) {
        uVar15 = uVar11;
      }
      sVar8 = recv(this->socket_,
                   (this->buffer_)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar12,
                   uVar15 - uVar12,0);
      if (0 < (long)sVar8) {
        this->last_activity_ = tVar6;
        LOCK();
        (this->wcount_).super___atomic_base<unsigned_long>._M_i =
             (this->wcount_).super___atomic_base<unsigned_long>._M_i + sVar8;
        UNLOCK();
        return sVar8 == uVar15 - uVar12;
      }
      if (-1 < (long)sVar8) {
        disconnect(this);
        return false;
      }
      puVar5 = (uint *)__errno_location();
    } while (*puVar5 == 4);
    if (*puVar5 == 0xb) {
      if (tVar6 - this->last_activity_ <= this->inactivity_timeout_) {
        return false;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"rapic: inactivity timeout");
      pcVar13 = std::runtime_error::~runtime_error;
      puVar14 = &std::runtime_error::typeinfo;
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x20);
      uVar1 = *puVar5;
      peVar10 = (error_category *)std::_V2::system_category();
      __ec_01._4_4_ = 0;
      __ec_01._M_value = uVar1;
      __ec_01._M_cat = peVar10;
      std::system_error::system_error((system_error *)this_00,__ec_01,"rapic: recv failure");
      pcVar13 = std::system_error::~system_error;
      puVar14 = &std::system_error::typeinfo;
    }
    __cxa_throw(this_00,puVar14,pcVar13);
  }
  iVar3 = this->socket_;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    (&res + lVar4 * 2)[0] = 0;
    (&res + lVar4 * 2)[1] = 0;
  }
  *(ulong *)(&res + (long)(iVar3 / 0x40) * 2) =
       *(ulong *)(&res + (long)(iVar3 / 0x40) * 2) | 1L << ((byte)iVar3 & 0x3f);
  while( true ) {
    _len = 0;
    local_b0 = 0;
    iVar2 = select(iVar3 + 1,(fd_set *)0x0,(fd_set *)&res,(fd_set *)0x0,(timeval *)&len);
    if (iVar2 != -1) break;
    puVar5 = (uint *)__errno_location();
    if (*puVar5 != 4) {
      psVar9 = (system_error *)__cxa_allocate_exception(0x20);
      uVar1 = *puVar5;
      peVar10 = (error_category *)std::_V2::system_category();
      __ec._4_4_ = 0;
      __ec._M_value = uVar1;
      __ec._M_cat = peVar10;
      std::system_error::system_error(psVar9,__ec,"rapic: select failure");
      __cxa_throw(psVar9,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  if (iVar2 != 1) {
    return false;
  }
  res = 0;
  _len = CONCAT44(uStack_b4,4);
  iVar3 = getsockopt(this->socket_,1,4,&res,&len);
  if (iVar3 < 0) {
    psVar9 = (system_error *)__cxa_allocate_exception(0x20);
    puVar5 = (uint *)__errno_location();
    uVar1 = *puVar5;
    peVar10 = (error_category *)std::_V2::system_category();
    __ec_02._4_4_ = 0;
    __ec_02._M_value = uVar1;
    __ec_02._M_cat = peVar10;
    std::system_error::system_error(psVar9,__ec_02,"rapic: getsockopt failure");
  }
  else {
    if (res == 0x73) {
      return false;
    }
    if (-1 < res) {
      this->state_ = established;
      goto LAB_001087dd;
    }
    psVar9 = (system_error *)__cxa_allocate_exception(0x20);
    iVar3 = res;
    peVar10 = (error_category *)std::_V2::system_category();
    __ec_03._4_4_ = 0;
    __ec_03._M_value = iVar3;
    __ec_03._M_cat = peVar10;
    std::system_error::system_error(psVar9,__ec_03,"rapic: failed to establish connection (async)");
  }
  __cxa_throw(psVar9,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

auto client::process_traffic() -> bool
try
{
  // sanity check
  if (state_ == rapic::connection_state::disconnected)
    return false;

  // need to check our connection attempt progress
  if (state_ == rapic::connection_state::in_progress)
  {
    /* SO_ERROR is only set once the socket is writeable, so manually check via select that it is.
     * without this check clients can call process_traffic() before the socket is writeable and cause
     * the connection to look established before it really is. */
    if (!is_socket_writeable(socket_))
      return false;

    // get the socket error status
    int res = 0; socklen_t len = sizeof(res);
    if (getsockopt(socket_, SOL_SOCKET, SO_ERROR, &res, &len) < 0)
      throw std::system_error{errno, std::system_category(), "rapic: getsockopt failure"};

    // not connected yet?
    if (res == EINPROGRESS)
      return false;

    // okay, connection attempt is complete.  did it succeed?
    if (res < 0)
      throw std::system_error{res, std::system_category(), "rapic: failed to establish connection (async)"};

    state_ = rapic::connection_state::established;
  }

  // get current time
  auto now = time(NULL);

  // do we need to send a keepalive? (ie: RDRSTAT)
  if (now - last_keepalive_ > keepalive_period_)
  {
    wbuffer_.append(msg_keepalive);
    last_keepalive_ = now;
  }

  // write everything we can
  if (!wbuffer_.empty())
  {
    // write as much as we can
    ssize_t ret;
    while ((ret = write(socket_, wbuffer_.c_str(), wbuffer_.size())) == -1)
    {
      if (errno == EAGAIN || errno == EWOULDBLOCK)
      {
        ret = 0;
        break;
      }
      else if (errno != EINTR)
        throw std::system_error{errno, std::system_category(), "rapic: write failure"};
    }

    // remove the written data from the buffer
    wbuffer_.erase(0, ret);
  }

  // read everything we can
  while (true)
  {
    // if our buffer is full return and allow client to do some reading
    if (wcount_ - rcount_ == capacity_)
      return true;

    // determine current read and write positions
    auto rpos = rcount_ % capacity_;
    auto wpos = wcount_ % capacity_;

    // see how much _contiguous_ space is left in our buffer (may be less than total available write space)
    auto space = wpos < rpos ? rpos - wpos : capacity_ - wpos;

    // read some data off the wire
    auto bytes = recv(socket_, &buffer_[wpos], space, 0);
    if (bytes > 0)
    {
      // reset our inactivity timeout
      last_activity_ = now;

      // advance our write position
      wcount_ += bytes;

      // if we read as much as we asked for there may be more still waiting so return true
      return static_cast<size_t>(bytes) == space;
    }
    else if (bytes < 0)
    {
      // if we've run out of data to read stop trying
      if (errno == EAGAIN || errno == EWOULDBLOCK)
      {
        // check our inactivity timeout
        if (now - last_activity_ > inactivity_timeout_)
          throw std::runtime_error{"rapic: inactivity timeout"};

        return false;
      }

      // if we were interrupted by a signal handler just try again
      if (errno == EINTR)
        continue;

      // a real receive error - kill the connection
      throw std::system_error{errno, std::system_category(), "rapic: recv failure"};
    }
    else /* if (bytes == 0) */
    {
      // connection has been closed normally by the remote side
      disconnect();
      return false;
    }
  }
}
catch (...)
{
  disconnect();
  throw;
}